

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  int iVar5;
  int in_ECX;
  long *in_RDX;
  byte *in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  bool bVar6;
  int sortFlags;
  int nCmp_1;
  int nStr;
  int nCmp;
  i64 rhs;
  i64 lhs;
  uchar *aKey1;
  KeyInfo *pKeyInfo;
  Mem *pRhs;
  int rc;
  u32 idx1;
  int i;
  u32 d1;
  u32 serial_type;
  u32 s1;
  Mem mem1;
  u32 szHdr1;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  Mem *in_stack_ffffffffffffff58;
  Mem *in_stack_ffffffffffffff60;
  double *local_88;
  int local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  int local_54;
  u32 local_50;
  double local_48;
  byte *local_40;
  uint local_38;
  undefined2 local_34;
  undefined1 local_32;
  undefined8 local_30;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  local_7c = 0;
  local_88 = (double *)in_RDX[1];
  memcpy(&local_48,&DAT_002ab090,0x38);
  if (in_ECX == 0) {
    local_c = (uint)*in_RSI;
    if (local_c < 0x80) {
      local_78 = 1;
    }
    else {
      bVar3 = sqlite3GetVarint32((uchar *)CONCAT44(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38),
                                 (u32 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ));
      local_78 = (uint)bVar3;
    }
    local_70 = local_c;
    local_74 = 0;
  }
  else {
    bVar3 = in_RSI[1];
    if (bVar3 < 0x80) {
      local_78 = 2;
    }
    else {
      bVar2 = sqlite3GetVarint32((uchar *)CONCAT44(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38),
                                 (u32 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ));
      local_78 = bVar2 + 1;
    }
    in_stack_ffffffffffffff44 = (uint)*in_RSI;
    local_c = in_stack_ffffffffffffff44;
    uVar4 = sqlite3VdbeSerialTypeLen((uint)bVar3);
    local_70 = in_stack_ffffffffffffff44 + uVar4;
    local_74 = 1;
    local_88 = local_88 + 7;
  }
  if (in_EDI < local_70) {
    iVar5 = sqlite3CorruptError(0);
    *(char *)((long)in_RDX + 0x1f) = (char)iVar5;
    local_54 = 0;
  }
  else {
    do {
      if ((*(ushort *)((long)local_88 + 0x14) & 0x24) == 0) {
        if ((*(ushort *)((long)local_88 + 0x14) & 8) == 0) {
          if ((*(ushort *)((long)local_88 + 0x14) & 2) == 0) {
            if ((*(ushort *)((long)local_88 + 0x14) & 0x10) == 0) {
              local_50 = (u32)in_RSI[local_78];
              if (((local_50 != 0) && (local_50 != 10)) &&
                 ((local_50 != 7 ||
                  (iVar5 = serialGet7((uchar *)CONCAT44(in_stack_ffffffffffffff3c,
                                                        in_stack_ffffffffffffff38),
                                      (Mem *)CONCAT44(in_stack_ffffffffffffff34,
                                                      in_stack_ffffffffffffff30)), iVar5 == 0)))) {
                local_7c = 1;
              }
            }
            else {
              bVar3 = in_RSI[local_78];
              local_50 = (u32)bVar3;
              if (0x7f < local_50) {
                sqlite3GetVarint32((uchar *)CONCAT44(in_stack_ffffffffffffff3c,
                                                     in_stack_ffffffffffffff38),
                                   (u32 *)CONCAT44(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30));
              }
              if ((local_50 < 0xc) || ((bVar3 & 1) != 0)) {
                local_7c = -1;
              }
              else {
                in_stack_ffffffffffffff50 = local_50 - 0xc >> 1;
                if (in_EDI < local_70 + in_stack_ffffffffffffff50) {
                  iVar5 = sqlite3CorruptError(0);
                  *(char *)((long)in_RDX + 0x1f) = (char)iVar5;
                  local_54 = 0;
                  goto LAB_0018a1de;
                }
                if ((*(ushort *)((long)local_88 + 0x14) & 0x400) == 0) {
                  in_stack_ffffffffffffff3c = in_stack_ffffffffffffff50;
                  if (*(int *)(local_88 + 2) <= (int)in_stack_ffffffffffffff50) {
                    in_stack_ffffffffffffff3c = *(uint *)(local_88 + 2);
                  }
                  in_stack_ffffffffffffff4c = in_stack_ffffffffffffff3c;
                  local_7c = memcmp(in_RSI + local_70,(void *)local_88[1],
                                    (long)(int)in_stack_ffffffffffffff3c);
                  if (local_7c == 0) {
                    local_7c = in_stack_ffffffffffffff50 - *(int *)(local_88 + 2);
                  }
                }
                else {
                  iVar5 = isAllZero((char *)(in_RSI + local_70),in_stack_ffffffffffffff50);
                  if (iVar5 == 0) {
                    local_7c = 1;
                  }
                  else {
                    local_7c = in_stack_ffffffffffffff50 - *(int *)local_88;
                  }
                }
              }
            }
          }
          else {
            bVar3 = in_RSI[local_78];
            local_50 = (u32)bVar3;
            if (0x7f < local_50) {
              sqlite3GetVarint32((uchar *)CONCAT44(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38),
                                 (u32 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ));
            }
            if (local_50 < 0xc) {
              local_7c = -1;
            }
            else if ((bVar3 & 1) == 0) {
              local_7c = 1;
            }
            else {
              local_38 = local_50 - 0xc >> 1;
              if ((in_EDI < local_70 + local_38) ||
                 (lVar1 = *in_RDX, (int)(uint)*(ushort *)(lVar1 + 8) <= (int)local_74)) {
                iVar5 = sqlite3CorruptError(0);
                *(char *)((long)in_RDX + 0x1f) = (char)iVar5;
                local_54 = 0;
                goto LAB_0018a1de;
              }
              if (*(long *)(lVar1 + 0x20 + (long)(int)local_74 * 8) == 0) {
                in_stack_ffffffffffffff40 = local_38;
                if (*(int *)(local_88 + 2) <= (int)local_38) {
                  in_stack_ffffffffffffff40 = *(uint *)(local_88 + 2);
                }
                in_stack_ffffffffffffff54 = in_stack_ffffffffffffff40;
                local_7c = memcmp(in_RSI + local_70,(void *)local_88[1],
                                  (long)(int)in_stack_ffffffffffffff40);
                if (local_7c == 0) {
                  local_7c = local_38 - *(int *)(local_88 + 2);
                }
              }
              else {
                local_32 = *(undefined1 *)(lVar1 + 4);
                local_30 = *(undefined8 *)(lVar1 + 0x10);
                local_34 = 2;
                local_40 = in_RSI + local_70;
                local_7c = vdbeCompareMemString
                                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                      (CollSeq *)
                                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                      (u8 *)CONCAT44(in_stack_ffffffffffffff4c,
                                                     in_stack_ffffffffffffff48));
              }
            }
          }
        }
        else {
          local_50 = (u32)in_RSI[local_78];
          if (local_50 < 10) {
            if (local_50 == 0) {
              local_7c = -1;
            }
            else if (local_50 == 7) {
              iVar5 = serialGet7((uchar *)CONCAT44(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38),
                                 (Mem *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ));
              if (iVar5 == 0) {
                if (*local_88 <= local_48) {
                  if (*local_88 <= local_48 && local_48 != *local_88) {
                    local_7c = 1;
                  }
                }
                else {
                  local_7c = -1;
                }
              }
              else {
                local_7c = -1;
              }
            }
            else {
              sqlite3VdbeSerialGet
                        ((uchar *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c,
                         (Mem *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
              local_7c = sqlite3IntFloatCompare
                                   (CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                    (double)CONCAT44(in_stack_ffffffffffffff34,
                                                     in_stack_ffffffffffffff30));
            }
          }
          else {
            local_7c = 1;
            if (local_50 == 10) {
              local_7c = -1;
            }
          }
        }
      }
      else {
        local_50 = (u32)in_RSI[local_78];
        if (local_50 < 10) {
          if (local_50 == 0) {
            local_7c = -1;
          }
          else if (local_50 == 7) {
            serialGet7((uchar *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (Mem *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
            local_7c = sqlite3IntFloatCompare
                                 (CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                  (double)CONCAT44(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30));
            local_7c = -local_7c;
          }
          else {
            in_stack_ffffffffffffff60 = (Mem *)vdbeRecordDecodeInt(local_50,in_RSI + local_70);
            in_stack_ffffffffffffff58 = (Mem *)*local_88;
            if ((long)in_stack_ffffffffffffff60 < (long)in_stack_ffffffffffffff58) {
              local_7c = -1;
            }
            else if ((long)in_stack_ffffffffffffff58 < (long)in_stack_ffffffffffffff60) {
              local_7c = 1;
            }
          }
        }
        else {
          local_7c = 1;
          if (local_50 == 10) {
            local_7c = -1;
          }
        }
      }
      if (local_7c != 0) {
        bVar3 = *(byte *)(*(long *)(*in_RDX + 0x18) + (long)(int)local_74);
        if (bVar3 != 0) {
          if ((bVar3 & 2) != 0) {
            bVar6 = true;
            if (local_50 != 0) {
              bVar6 = (*(ushort *)((long)local_88 + 0x14) & 1) != 0;
            }
            if ((bool)(bVar3 & 1) == bVar6) goto LAB_0018a11d;
          }
          local_7c = -local_7c;
        }
LAB_0018a11d:
        local_54 = local_7c;
        goto LAB_0018a1de;
      }
      local_74 = local_74 + 1;
      if (local_74 == *(ushort *)((long)in_RDX + 0x1c)) {
LAB_0018a1c5:
        *(undefined1 *)((long)in_RDX + 0x22) = 1;
        local_54 = (int)*(char *)((long)in_RDX + 0x1e);
        goto LAB_0018a1de;
      }
      local_88 = local_88 + 7;
      uVar4 = sqlite3VdbeSerialTypeLen(local_50);
      local_70 = uVar4 + local_70;
      if (in_EDI < local_70) goto LAB_0018a1c5;
      iVar5 = sqlite3VarintLen((ulong)local_50);
      local_78 = iVar5 + local_78;
    } while (local_78 < local_c);
    iVar5 = sqlite3CorruptError(0);
    *(char *)((long)in_RDX + 0x1f) = (char)iVar5;
    local_54 = 0;
  }
LAB_0018a1de:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1 = aKey1[1];
    if( s1<0x80 ){
      idx1 = 2;
    }else{
      idx1 = 1 + sqlite3GetVarint32(&aKey1[1], &s1);
    }
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    if( (szHdr1 = aKey1[0])<0x80 ){
      idx1 = 1;
    }else{
      idx1 = sqlite3GetVarint32(aKey1, &szHdr1);
    }
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortFlags!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  while( 1 /*exit-by-break*/ ){
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        serialGet7(&aKey1[d1], &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future
        ** use", so it doesn't really matter what the results of comparing
        ** them to numeric values are.  */
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        if( serial_type==7 ){
          if( serialGet7(&aKey1[d1], &mem1) ){
            rc = -1;  /* mem1 is a NaN */
          }else if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }else{
            assert( rc==0 );
          }
        }else{
          sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n;
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      if( serial_type==0
       || serial_type==10
       || (serial_type==7 && serialGet7(&aKey1[d1], &mem1)!=0)
      ){
        assert( rc==0 );
      }else{
        rc = 1;
      }
    }

    if( rc!=0 ){
      int sortFlags = pPKey2->pKeyInfo->aSortFlags[i];
      if( sortFlags ){
        if( (sortFlags & KEYINFO_ORDER_BIGNULL)==0
         || ((sortFlags & KEYINFO_ORDER_DESC)
           !=(serial_type==0 || (pRhs->flags&MEM_Null)))
        ){
          rc = -rc;
        }
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    if( d1>(unsigned)nKey1 ) break;
    idx1 += sqlite3VarintLen(serial_type);
    if( idx1>=(unsigned)szHdr1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;  /* Corrupt index */
    }
  }

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc)
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}